

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_new_session_ticket(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  mbedtls_ssl_session *pmVar4;
  int iVar5;
  uchar *puVar6;
  size_t sVar7;
  ulong uVar8;
  ulong __size;
  
  iVar5 = mbedtls_ssl_read_record(ssl);
  if (iVar5 == 0) {
    if (ssl->in_msgtype == 0x16) {
      puVar2 = ssl->in_msg;
      if (*puVar2 == '\x04') {
        uVar8 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8;
        if (uVar8 + 10 <= ssl->in_hslen) {
          uVar8 = uVar8 | 4;
          __size = (ulong)(ushort)(*(ushort *)(puVar2 + uVar8 + 4) << 8 |
                                  *(ushort *)(puVar2 + uVar8 + 4) >> 8);
          if (__size + uVar8 + 6 == ssl->in_hslen) {
            uVar1 = *(uint *)(puVar2 + uVar8);
            ssl->handshake->new_session_ticket = 0;
            ssl->state = 0xc;
            if (__size == 0) {
              return 0;
            }
            sVar3 = ssl->session_negotiate->ticket_len;
            if (sVar3 != 0) {
              puVar6 = ssl->session_negotiate->ticket;
              sVar7 = 0;
              do {
                puVar6[sVar7] = '\0';
                sVar7 = sVar7 + 1;
              } while (sVar3 != sVar7);
            }
            free(ssl->session_negotiate->ticket);
            pmVar4 = ssl->session_negotiate;
            puVar6 = (uchar *)calloc(1,__size);
            pmVar4->ticket = (uchar *)0x0;
            pmVar4->ticket_len = 0;
            if (puVar6 != (uchar *)0x0) {
              memcpy(puVar6,puVar2 + uVar8 + 6,__size);
              pmVar4->ticket = puVar6;
              pmVar4->ticket_len = __size;
              pmVar4->ticket_lifetime =
                   uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
              pmVar4->id_len = 0;
              return 0;
            }
            mbedtls_ssl_send_alert_message(ssl,'\x02','P');
            return -0x7f00;
          }
        }
      }
      mbedtls_ssl_send_alert_message(ssl,'\x02','2');
      iVar5 = -0x6e00;
    }
    else {
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      iVar5 = -0x7700;
    }
  }
  return iVar5;
}

Assistant:

static int ssl_parse_new_session_ticket( mbedtls_ssl_context *ssl )
{
    int ret;
    uint32_t lifetime;
    size_t ticket_len;
    unsigned char *ticket;
    const unsigned char *msg;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse new session ticket" ) );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad new session ticket message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * struct {
     *     uint32 ticket_lifetime_hint;
     *     opaque ticket<0..2^16-1>;
     * } NewSessionTicket;
     *
     * 0  .  3   ticket_lifetime_hint
     * 4  .  5   ticket_len (n)
     * 6  .  5+n ticket content
     */
    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_NEW_SESSION_TICKET ||
        ssl->in_hslen < 6 + mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad new session ticket message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_NEW_SESSION_TICKET );
    }

    msg = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );

    lifetime = ( msg[0] << 24 ) | ( msg[1] << 16 ) |
               ( msg[2] <<  8 ) | ( msg[3]       );

    ticket_len = ( msg[4] << 8 ) | ( msg[5] );

    if( ticket_len + 6 + mbedtls_ssl_hs_hdr_len( ssl ) != ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad new session ticket message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_NEW_SESSION_TICKET );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ticket length: %d", ticket_len ) );

    /* We're not waiting for a NewSessionTicket message any more */
    ssl->handshake->new_session_ticket = 0;
    ssl->state = MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC;

    /*
     * Zero-length ticket means the server changed his mind and doesn't want
     * to send a ticket after all, so just forget it
     */
    if( ticket_len == 0 )
        return( 0 );

    mbedtls_zeroize( ssl->session_negotiate->ticket,
                      ssl->session_negotiate->ticket_len );
    mbedtls_free( ssl->session_negotiate->ticket );
    ssl->session_negotiate->ticket = NULL;
    ssl->session_negotiate->ticket_len = 0;

    if( ( ticket = mbedtls_calloc( 1, ticket_len ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "ticket alloc failed" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    memcpy( ticket, msg + 6, ticket_len );

    ssl->session_negotiate->ticket = ticket;
    ssl->session_negotiate->ticket_len = ticket_len;
    ssl->session_negotiate->ticket_lifetime = lifetime;

    /*
     * RFC 5077 section 3.4:
     * "If the client receives a session ticket from the server, then it
     * discards any Session ID that was sent in the ServerHello."
     */
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ticket in use, discarding session id" ) );
    ssl->session_negotiate->id_len = 0;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse new session ticket" ) );

    return( 0 );
}